

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void weather_update(void)

{
  int iVar1;
  int iVar2;
  AREA_DATA_conflict *area;
  int temptot;
  int skytot;
  int average;
  int season;
  int random;
  int i;
  char buf [4608];
  int in_stack_ffffffffffffedcc;
  undefined8 in_stack_ffffffffffffedd0;
  AREA_DATA_conflict *local_1228;
  int local_1220;
  int local_121c;
  int local_120c;
  char local_1208 [4616];
  
  iVar2 = time_info.season;
  local_1228 = area_first;
  do {
    if (local_1228 == (AREA_DATA_conflict *)0x0) {
      for (local_1228 = area_first; local_1228 != (AREA_DATA_conflict *)0x0;
          local_1228 = local_1228->next) {
        local_121c = 0;
        local_1220 = 0;
        for (local_120c = 0;
            (local_120c < 0x19 && (local_1228->adjacent[local_120c] != (AREA_DATA *)0x0));
            local_120c = local_120c + 1) {
          local_121c = local_1228->adjacent[local_120c]->sky + local_121c;
          local_1220 = local_1228->adjacent[local_120c]->temp + local_1220;
        }
        if (0 < local_120c) {
          local_121c = local_121c / (local_120c + 1);
          iVar2 = local_121c - local_1228->sky;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          if (3 < iVar2) {
            local_1228->sky = (short)((long)(local_1228->sky + local_121c) / 2);
          }
          local_1220 = local_1220 / (local_120c + 1);
          iVar2 = local_1220 - local_1228->temp;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          if (1 < iVar2) {
            local_1228->temp = (short)((long)(local_1228->sky + local_1220) / 2);
          }
        }
        if ((5 < local_1228->sky) && (local_1228->temp < 2)) {
          local_1228->temp = 2;
        }
        if (((local_1228->sky == 4) || (local_1228->sky == 5)) || (local_1228->sky == 7)) {
          local_1228->wind = local_1228->wind + 1;
        }
        if (local_1228->climate == 0) {
          local_1228->sky = 1;
          local_1228->temp = 1;
          local_1228->wind = 0;
        }
      }
      for (local_1228 = area_first; local_1228 != (AREA_DATA_conflict *)0x0;
          local_1228 = local_1228->next) {
        switch(local_1228->sky) {
        case 0:
          sprintf(local_1208,"There is not a cloud to be seen in the sky above.");
          break;
        case 1:
          sprintf(local_1208,"A few clouds dot the skies above.");
          break;
        case 2:
          sprintf(local_1208,"A thick grey mass of clouds obscures the sky.");
          break;
        case 3:
          sprintf(local_1208,"A light drizzle falls from the sky.");
          break;
        case 4:
          sprintf(local_1208,"Sheets of rain pour down from the skies above.");
          break;
        case 5:
          sprintf(local_1208,
                  "Lightning flashes in the distance as a booming peal of thunder approaches.");
          break;
        case 6:
          sprintf(local_1208,"Scattered snowflakes drift down from the skies above.");
          break;
        case 7:
          sprintf(local_1208,"Driving snow sweeps down from the skies as a chill fills the air.");
          break;
        case 8:
          sprintf(local_1208,"Pebble-sized hailstones begin to fall from the skies.");
          break;
        default:
          local_1208[0] = '\0';
        }
        outdoors_echo((AREA_DATA_conflict *)buf._4528_8_,(char *)buf._4520_8_);
      }
      return;
    }
    iVar1 = number_percent();
    for (local_120c = 0; local_120c < 9; local_120c = local_120c + 1) {
      if (iVar1 <= *(short *)((long)local_1228->climate * 0x78 + 0x91a5fa + (long)iVar2 * 0x12 +
                             (long)local_120c * 2)) {
        local_1228->sky = (short)local_120c;
        break;
      }
    }
    iVar1 = number_percent();
    for (local_120c = 0; local_120c < 4; local_120c = local_120c + 1) {
      if (iVar1 <= *(short *)((long)local_1228->climate * 0x78 + 0x91a642 + (long)iVar2 * 8 +
                             (long)local_120c * 2)) {
        local_1228->temp = (short)local_120c;
        break;
      }
    }
    iVar1 = number_range((int)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedcc);
    local_1228->wind = (short)iVar1;
    local_1228 = local_1228->next;
  } while( true );
}

Assistant:

void weather_update(void)
{
	char buf[MSL];
	int i, random, season = time_info.season;
	int average = 0, skytot = 0, temptot = 0;
	AREA_DATA *area;

	/* Randomize sky, temperature, wind for each area, based on climate */
	for (area = area_first; area; area = area->next)
	{
		random = number_percent();

		for (i = 0; i < WeatherCondition::MaxWeatherCondition; i++)
		{
			if (random <= climate_table[area->climate].skyfreqs[season][i])
			{
				area->sky = i;
				break;
			}
		}

		random = number_percent();

		for (i = 0; i < Temperature::MaxTemperature; i++)
		{
			if (random <= climate_table[area->climate].tempfreqs[season][i])
			{
				area->temp = i;
				break;
			}
		}

		area->wind = number_range(0, 2);
	}

	/* Adjacent areas have a moderating influence on weather.  If there's
	 * a blizzard going on next door, it won't be perfectly sunny.  Similarly,
	 * it won't be hot and snowing at the same time, etc.  Just make sure that
	 * illogical combinations are eliminated. */
	for (area = area_first; area; area = area->next)
	{
		skytot = 0;
		temptot = 0;

		for (i = 0; i < MAX_ADJACENT; i++)
		{
			if (!area->adjacent[i])
				break;

			skytot += area->adjacent[i]->sky;
			temptot += area->adjacent[i]->temp;
		}

		if (i > 0)
		{
			average = skytot / (i + 1);

			if (abs(average - area->sky) >= 4)
				area->sky = (area->sky + average) / 2;

			average = temptot / (i + 1);

			if (abs(average - area->temp) >= 2)
				area->temp = (area->sky + average) / 2;
		}

		if (area->sky >= WeatherCondition::SnowFlurry && area->temp < Temperature::Cool)
			area->temp = Temperature::Cool;

		if (area->sky == WeatherCondition::Downpour
				 || area->sky == WeatherCondition::ThunderStorm
				 || area->sky == WeatherCondition::Blizzard)
			area->wind++;

		if (area->climate == Climate::None)
		{
			area->sky = WeatherCondition::PartlyCloudy;
			area->temp = Temperature::Warm;
			area->wind = Windspeed::Calm;
		}
	}

	/* Echo the changing weather to everyone who's outdoors. */
	for (area = area_first; area; area = area->next)
	{
		switch (area->sky)
		{
			case WeatherCondition::Clear:
				sprintf(buf, "There is not a cloud to be seen in the sky above.");
				break;
			case WeatherCondition::PartlyCloudy:
				sprintf(buf, "A few clouds dot the skies above.");
				break;
			case WeatherCondition::Overcast:
				sprintf(buf, "A thick grey mass of clouds obscures the sky.");
				break;
			case WeatherCondition::Drizzle:
				sprintf(buf, "A light drizzle falls from the sky.");
				break;
			case WeatherCondition::Downpour:
				sprintf(buf, "Sheets of rain pour down from the skies above.");
				break;
			case WeatherCondition::ThunderStorm:
				sprintf(buf, "Lightning flashes in the distance as a booming peal of thunder approaches.");
				break;
			case WeatherCondition::SnowFlurry:
				sprintf(buf, "Scattered snowflakes drift down from the skies above.");
				break;
			case WeatherCondition::Blizzard:
				sprintf(buf, "Driving snow sweeps down from the skies as a chill fills the air.");
				break;
			case WeatherCondition::Hail:
				sprintf(buf, "Pebble-sized hailstones begin to fall from the skies.");
				break;
			default:
				buf[0] = '\0';
				break;
		}

		outdoors_echo(area, buf);
	}
}